

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::makefacetverticesmap(tetgenmesh *this)

{
  uint *puVar1;
  uint uVar2;
  arraypool *paVar3;
  tetgenio *ptVar4;
  memorypool *pmVar5;
  uint uVar6;
  tetgenmesh *this_00;
  shellface *pppdVar7;
  arraypool *paVar8;
  long lVar9;
  int *piVar10;
  point *ppdVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  tetgenmesh *ptVar17;
  ulong uVar18;
  long *plVar19;
  tetgenmesh *this_01;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  bool bVar25;
  int local_74;
  tetgenmesh *local_68;
  tetgenmesh *local_60;
  long *local_58;
  tetgenmesh *local_50;
  long local_48;
  face *parysh1;
  undefined8 *local_38;
  
  if (this->b->verbose != 0) {
    puts("  Creating the facet vertices map.");
  }
  this_00 = (tetgenmesh *)operator_new(0x30);
  this_00->in = (tetgenio *)0x40000000008;
  this_00->addin = (tetgenio *)0x3ff0000000a;
  *(int *)&this_00->b = 0;
  this_00->bgm = (tetgenmesh *)0x0;
  this_00->tetrahedrons = (memorypool *)0x0;
  this_00->subfaces = (memorypool *)0x0;
  this_01 = (tetgenmesh *)this->subfaces;
  memorypool::traversalinit((memorypool *)this_01);
  pppdVar7 = shellfacetraverse(this_01,this->subfaces);
  uVar6 = 0;
  local_74 = 0;
  ptVar17 = this;
  local_50 = this_00;
  while (pppdVar7 != (shellface *)0x0) {
    if ((*(byte *)((long)pppdVar7 + (long)this->shmarkindex * 4 + 4) & 1) == 0) {
      local_60 = ptVar17;
      paVar8 = (arraypool *)operator_new(0x30);
      paVar8->objectbytes = 8;
      paVar8->objectsperblock = 0x100;
      paVar8->log2objectsperblock = 8;
      paVar8->objectsperblockmark = 0xff;
      paVar8->toparraylen = 0;
      paVar8->toparray = (char **)0x0;
      paVar8->objects = 0;
      paVar8->totalmemory = 0;
      for (lVar16 = 3; lVar16 != 6; lVar16 = lVar16 + 1) {
        uVar12 = *(uint *)((long)pppdVar7[lVar16] + (long)this->pointmarkindex * 4 + 4);
        if (((int)uVar12 >> 8) - 8U < 0xfffffffe) {
          *(uint *)((long)pppdVar7[lVar16] + (long)this->pointmarkindex * 4 + 4) = uVar12 | 1;
          arraypool::newindex(paVar8,&local_68);
          local_60 = local_68;
          local_68->in = (tetgenio *)pppdVar7[lVar16];
        }
      }
      puVar1 = (uint *)((long)pppdVar7 + (long)this->shmarkindex * 4 + 4);
      *puVar1 = *puVar1 | 1;
      arraypool::newindex(this->caveshlist,&local_58);
      *local_58 = (long)pppdVar7;
      *(undefined4 *)(local_58 + 1) = 0;
      lVar16 = 0;
      plVar19 = local_58;
      while (this_00 = local_50, paVar3 = this->caveshlist, lVar16 < paVar3->objects) {
        lVar9 = (long)paVar3->objectbytes * (long)(int)(paVar3->objectsperblockmark & (uint)lVar16);
        plVar19 = (long *)(paVar3->toparray
                           [(uint)lVar16 >> ((byte)paVar3->log2objectsperblock & 0x1f)] + lVar9);
        *(uint *)(*(long *)(paVar3->toparray
                            [(uint)lVar16 >> ((byte)paVar3->log2objectsperblock & 0x1f)] + lVar9) +
                  8 + (long)this->shmarkindex * 4) = uVar6;
        iVar15 = 3;
        local_48 = lVar16;
        while (bVar25 = iVar15 != 0, iVar15 = iVar15 + -1, bVar25) {
          iVar13 = (int)plVar19[1];
          if (*(long *)(*plVar19 + 0x30 + (long)(iVar13 >> 1) * 8) == 0) {
            uVar18 = *(ulong *)(*plVar19 + (long)(iVar13 >> 1) * 8);
            pppdVar7 = (shellface *)(uVar18 & 0xfffffffffffffff8);
            lVar16 = (long)this->shmarkindex;
            uVar12 = *(uint *)((long)pppdVar7 + lVar16 * 4 + 4);
            if ((uVar12 & 1) == 0) {
              uVar24 = (uint)uVar18;
              ptVar4 = (tetgenio *)pppdVar7[sapexpivot[uVar24 & 7]];
              uVar2 = (&ptVar4->mesh_dim)[this->pointmarkindex];
              if (((uVar2 & 1) == 0) && (((int)uVar2 >> 8) - 8U < 0xfffffffe)) {
                (&ptVar4->mesh_dim)[this->pointmarkindex] = uVar2 | 1;
                arraypool::newindex(paVar8,&local_68);
                local_60 = local_68;
                local_68->in = ptVar4;
                lVar16 = (long)this->shmarkindex;
                uVar12 = *(uint *)((long)pppdVar7 + lVar16 * 4 + 4);
              }
              *(uint *)((long)pppdVar7 + lVar16 * 4 + 4) = uVar12 | 1;
              arraypool::newindex(this->caveshlist,&parysh1);
              parysh1->sh = pppdVar7;
              parysh1->shver = uVar24 & 7;
              iVar13 = (int)plVar19[1];
            }
          }
          *(int *)(plVar19 + 1) = snextpivot[iVar13];
        }
        lVar16 = local_48 + 1;
      }
      lVar16 = paVar8->objects;
      lVar9 = lVar16;
      if (lVar16 < 1) {
        lVar9 = 0;
      }
      ptVar17 = local_60;
      for (lVar20 = 0; lVar9 != lVar20; lVar20 = lVar20 + 1) {
        lVar22 = (long)paVar8->objectbytes * (long)(int)(paVar8->objectsperblockmark & (uint)lVar20)
        ;
        ptVar17 = (tetgenmesh *)
                  (paVar8->toparray[(uint)lVar20 >> ((byte)paVar8->log2objectsperblock & 0x1f)] +
                  lVar22);
        puVar1 = (uint *)(*(long *)(paVar8->toparray
                                    [(uint)lVar20 >> ((byte)paVar8->log2objectsperblock & 0x1f)] +
                                   lVar22) + 4 + (long)this->pointmarkindex * 4);
        *puVar1 = *puVar1 & 0xfffffffe;
      }
      local_74 = local_74 + (int)lVar16;
      paVar3->objects = 0;
      this_01 = local_50;
      local_68 = ptVar17;
      local_58 = plVar19;
      arraypool::newindex((arraypool *)local_50,&local_38);
      *local_38 = paVar8;
      uVar6 = uVar6 + 1;
    }
    pppdVar7 = shellfacetraverse(this_01,this->subfaces);
  }
  ptVar17 = (tetgenmesh *)this->subfaces;
  memorypool::traversalinit((memorypool *)ptVar17);
  while( true ) {
    pppdVar7 = shellfacetraverse(ptVar17,this->subfaces);
    if (pppdVar7 == (shellface *)0x0) break;
    puVar1 = (uint *)((long)pppdVar7 + (long)this->shmarkindex * 4 + 4);
    *puVar1 = *puVar1 & 0xfffffffe;
  }
  if (this->b->verbose != 0) {
    printf("  Found %ld facets.\n");
  }
  uVar18 = (long)(int)uVar6 * 4 + 4;
  if ((int)uVar6 < -1) {
    uVar18 = 0xffffffffffffffff;
  }
  piVar10 = (int *)operator_new__(uVar18);
  this->idx2facetlist = piVar10;
  uVar18 = 0xffffffffffffffff;
  if (-1 < local_74) {
    uVar18 = (long)local_74 * 8;
  }
  ppdVar11 = (point *)operator_new__(uVar18);
  this->facetverticeslist = ppdVar11;
  this->totalworkmemory = this->totalworkmemory + (long)(int)uVar6 * 4 + 4 + (long)local_74 * 8;
  *piVar10 = 0;
  uVar18 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar18 = 0;
  }
  uVar14 = 0;
  lVar16 = 0;
  while (uVar14 != uVar18) {
    piVar10 = *(int **)((long)&(&this_00->bgm->in)
                               [(uint)uVar14 >> (*(byte *)&this_00->addin & 0x1f)]->firstnumber +
                       (long)*(int *)&this_00->in *
                       (long)(int)(*(int *)((long)&this_00->addin + 4) & (uint)uVar14));
    uVar21 = *(ulong *)(piVar10 + 8);
    this->idx2facetlist[uVar14 + 1] = this->idx2facetlist[uVar14] + (int)uVar21;
    uVar14 = uVar14 + 1;
    lVar16 = (long)(int)lVar16;
    if ((long)uVar21 < 1) {
      uVar21 = 0;
    }
    for (uVar23 = 0; uVar21 != uVar23; uVar23 = uVar23 + 1) {
      this->facetverticeslist[lVar16] =
           *(point *)(*(long *)(*(long *)(piVar10 + 6) +
                               (ulong)((uint)uVar23 >> (*(byte *)(piVar10 + 2) & 0x1f)) * 8) +
                     (long)*piVar10 * (long)(int)(piVar10[3] & (uint)uVar23));
      lVar16 = lVar16 + 1;
    }
  }
  pmVar5 = this_00->tetrahedrons;
  for (lVar16 = 0; lVar16 < (long)pmVar5; lVar16 = lVar16 + 1) {
    paVar8 = *(arraypool **)
              ((long)&(&this_00->bgm->in)[(uint)lVar16 >> (*(byte *)&this_00->addin & 0x1f)]->
                      firstnumber +
              (long)*(int *)&this_00->in *
              (long)(int)(*(int *)((long)&this_00->addin + 4) & (uint)lVar16));
    if (paVar8 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar8);
    }
    operator_delete(paVar8,0x30);
  }
  arraypool::~arraypool((arraypool *)this_00);
  operator_delete(this_00,0x30);
  return;
}

Assistant:

void tetgenmesh::makefacetverticesmap()
{
  arraypool *facetvertexlist, *vertlist, **paryvertlist;
  face subloop, neighsh, *parysh, *parysh1;
  point pa, *ppt, *parypt;
  verttype vt;
  int facetindex, totalvertices;
  int i, j, k;

  if (b->verbose) {
    printf("  Creating the facet vertices map.\n");
  }

  facetvertexlist = new arraypool(sizeof(arraypool *), 10);
  facetindex = totalvertices = 0;

  subfaces->traversalinit();
  subloop.sh = shellfacetraverse(subfaces);
  while (subloop.sh != NULL) {
    if (!sinfected(subloop)) {
      // A new facet. Create its vertices list.
      vertlist = new arraypool(sizeof(point *), 8);
      ppt = (point *) &(subloop.sh[3]);
      for (k = 0; k < 3; k++) {
        vt = pointtype(ppt[k]);
        if ((vt != FREESEGVERTEX) && (vt != FREEFACETVERTEX)) {
          pinfect(ppt[k]);
          vertlist->newindex((void **) &parypt);
          *parypt = ppt[k];
        }
      }
      sinfect(subloop);
      caveshlist->newindex((void **) &parysh);
      *parysh = subloop;
      for (i = 0; i < caveshlist->objects; i++) {
        parysh = (face *) fastlookup(caveshlist, i);
        setfacetindex(*parysh, facetindex);
        for (j = 0; j < 3; j++) {
          if (!isshsubseg(*parysh)) {
            spivot(*parysh, neighsh);
            if (!sinfected(neighsh)) {
              pa = sapex(neighsh);
              if (!pinfected(pa)) {
                vt = pointtype(pa);
                if ((vt != FREESEGVERTEX) && (vt != FREEFACETVERTEX)) {
                  pinfect(pa);
                  vertlist->newindex((void **) &parypt);
                  *parypt = pa;
                }
              }
              sinfect(neighsh);
              caveshlist->newindex((void **) &parysh1);
              *parysh1 = neighsh;
            }
          }
          senextself(*parysh);
        }
      } // i
      totalvertices += (int) vertlist->objects;
      // Uninfect facet vertices.
      for (k = 0; k < vertlist->objects; k++) {
        parypt = (point *) fastlookup(vertlist, k);
        puninfect(*parypt);
      }
      caveshlist->restart();
      // Save this vertex list.
      facetvertexlist->newindex((void **) &paryvertlist);
      *paryvertlist = vertlist;
      facetindex++;
    } 
    subloop.sh = shellfacetraverse(subfaces);
  }

  // All subfaces are infected. Uninfect them.
  subfaces->traversalinit();
  subloop.sh = shellfacetraverse(subfaces);
  while (subloop.sh != NULL) {
    suninfect(subloop);
    subloop.sh = shellfacetraverse(subfaces);
  }

  if (b->verbose) {
    printf("  Found %ld facets.\n", facetvertexlist->objects);
  }

  idx2facetlist = new int[facetindex + 1];
  facetverticeslist = new point[totalvertices];

  totalworkmemory += ((facetindex + 1) * sizeof(int) + 
                      totalvertices * sizeof(point *));

  idx2facetlist[0] = 0;
  for (i = 0, k = 0; i < facetindex; i++) {
    paryvertlist = (arraypool **) fastlookup(facetvertexlist, i);
    vertlist = *paryvertlist;
    idx2facetlist[i + 1] = (idx2facetlist[i] + (int) vertlist->objects);
    for (j = 0; j < vertlist->objects; j++) {
      parypt = (point *) fastlookup(vertlist, j);
      facetverticeslist[k] = *parypt;
      k++;
    }
  }

  // Free the lists.
  for (i = 0; i < facetvertexlist->objects; i++) {
    paryvertlist = (arraypool **) fastlookup(facetvertexlist, i);
    vertlist = *paryvertlist;
    delete vertlist;
  }
  delete facetvertexlist;
}